

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O0

void __thiscall
SuiteSessionTests::initiatorFixtureMessageTagsOutOfOrder_RejectHelper::
~initiatorFixtureMessageTagsOutOfOrder_RejectHelper
          (initiatorFixtureMessageTagsOutOfOrder_RejectHelper *this)

{
  ~initiatorFixtureMessageTagsOutOfOrder_RejectHelper
            ((initiatorFixtureMessageTagsOutOfOrder_RejectHelper *)&this[-1].m_details);
  return;
}

Assistant:

TEST_FIXTURE(initiatorFixture, MessageTagsOutOfOrder_Reject) {
  startTimeStamp = UtcTimeStamp(8, 8, 8, 13, 5, 2015);
  endTimeStamp = UtcTimeStamp(16, 16, 16, 13, 5, 2200);
  startTime = UtcTimeOnly( startTimeStamp );
  endTime = UtcTimeOnly( endTimeStamp );

  SessionID sessionID( BeginString( "FIX.4.2" ), SenderCompID( "TW" ), TargetCompID( "ISLD" ) );

  TimeRange sessionTime( startTime, endTime, 0, 31);

  DataDictionaryProvider provider;
  provider.addTransportDataDictionary( sessionID.getBeginString(), "../spec/FIX42.xml" );
  DataDictionary dictionary = provider.getSessionDataDictionary(sessionID.getBeginString());
  dictionary.preserveMessageFieldsOrder(true);
  dictionary.checkFieldsOutOfOrder(true);

  std::shared_ptr<DataDictionary> pDataDictionary = std::make_shared<DataDictionary>(dictionary);
  pDataDictionary->addHeaderField(115, false);
  pDataDictionary->addTrailerField(115, false);
  pDataDictionary->addMsgField(FIX::MsgType_Logon, 115);
  pDataDictionary->addMsgField(FIX::MsgType_NewOrderSingle, 115);
  pDataDictionary->addMsgField(FIX::MsgType_Reject, 115);
  provider.addTransportDataDictionary( sessionID.getBeginString(), pDataDictionary );

  object = new Session( *this, factory, sessionID, provider,
                         sessionTime, 1, 0 );

  FIX::Message sentLogon = createLogon( "TW", "ISLD", 1 );
  object->send(sentLogon);
  object->next();
  object->logon();

  FIX::Message receivedLogon = createLogon( "ISLD", "TW", 1 );
  object->next(receivedLogon, UtcTimeStamp());

  FIX42::NewOrderSingle newOrderSingle;
  newOrderSingle.clear();
  std::string newOrderSingleRawFIX;
  std::string delimSOH = "\x01";
  newOrderSingleRawFIX = "8=FIX.4.2" + delimSOH
  + "9=114" + delimSOH
  + "35=D" + delimSOH
  + "34=2" + delimSOH
  + "49=ISLD" + delimSOH
  + "56=TW" + delimSOH
  + "52=20190517-16:08:43" + delimSOH
  + "11=ID" + delimSOH
  + "21=1" + delimSOH
  + "40=1" + delimSOH
  + "35=D" + delimSOH //header field out of order and included in body as well
  + "54=1" + delimSOH
  + "55=SYMBOL" + delimSOH
  + "60=20190517-16:08:43" + delimSOH
  + "10=166" + delimSOH;
  newOrderSingle.setString(newOrderSingleRawFIX, false, pDataDictionary.get(), pDataDictionary.get());
  object->next( newOrderSingle, UtcTimeStamp() );

  CHECK_EQUAL(1, toReject);
}